

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::AddEnum
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,
          EnumValueDescriptor *value)

{
  EnumValueDescriptor *field_00;
  FieldDescriptor *message_00;
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  int number;
  Type TVar4;
  int value_00;
  Descriptor *pDVar5;
  EnumDescriptor *pEVar6;
  EnumDescriptor *pEVar7;
  ExtensionSet *this_00;
  FieldOptions *this_01;
  int local_2c;
  EnumValueDescriptor *local_28;
  EnumValueDescriptor *value_local;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  local_28 = value;
  value_local = (EnumValueDescriptor *)field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  pDVar5 = FieldDescriptor::containing_type(field);
  if (pDVar5 != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,(FieldDescriptor *)value_local,"AddEnum",
               "Field does not match message type.");
  }
  LVar2 = FieldDescriptor::label((FieldDescriptor *)value_local);
  if (LVar2 != LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,(FieldDescriptor *)value_local,"AddEnum",
               "Field is singular; the method requires a repeated field.");
  }
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)value_local);
  if (CVar3 != CPPTYPE_ENUM) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,(FieldDescriptor *)value_local,"AddEnum",CPPTYPE_ENUM);
  }
  pEVar6 = EnumValueDescriptor::type(local_28);
  pEVar7 = FieldDescriptor::enum_type((FieldDescriptor *)value_local);
  if (pEVar6 != pEVar7) {
    anon_unknown_0::ReportReflectionUsageEnumTypeError
              (this->descriptor_,(FieldDescriptor *)value_local,"AddEnum",local_28);
  }
  bVar1 = FieldDescriptor::is_extension((FieldDescriptor *)value_local);
  message_00 = field_local;
  field_00 = value_local;
  if (bVar1) {
    this_00 = MutableExtensionSet(this,(Message *)field_local);
    number = FieldDescriptor::number((FieldDescriptor *)value_local);
    TVar4 = FieldDescriptor::type((FieldDescriptor *)value_local);
    this_01 = FieldDescriptor::options((FieldDescriptor *)value_local);
    bVar1 = FieldOptions::packed(this_01);
    value_00 = EnumValueDescriptor::number(local_28);
    ExtensionSet::AddEnum
              (this_00,number,(FieldType)TVar4,bVar1,value_00,(FieldDescriptor *)value_local);
  }
  else {
    local_2c = EnumValueDescriptor::number(local_28);
    AddField<int>(this,(Message *)message_00,(FieldDescriptor *)field_00,&local_2c);
  }
  return;
}

Assistant:

void GeneratedMessageReflection::AddEnum(
    Message* message, const FieldDescriptor* field,
    const EnumValueDescriptor* value) const {
  USAGE_CHECK_ALL(AddEnum, REPEATED, ENUM);
  USAGE_CHECK_ENUM_VALUE(AddEnum);

  if (field->is_extension()) {
    MutableExtensionSet(message)->AddEnum(field->number(), field->type(),
                                          field->options().packed(),
                                          value->number(), field);
  } else {
    AddField<int>(message, field, value->number());
  }
}